

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

_Bool mi_heap_visit_blocks(mi_heap_t *heap,_Bool visit_blocks,mi_block_visit_fun *visitor,void *arg)

{
  mi_page_s *pmVar1;
  _Bool _Var2;
  ulong uVar3;
  _Bool _Var4;
  mi_heap_area_t local_70;
  mi_page_t *local_38;
  
  if (heap == (mi_heap_t *)0x0) {
    _Var4 = false;
  }
  else if (heap->page_count == 0) {
    _Var4 = false;
  }
  else {
    _Var4 = false;
    uVar3 = 0;
    do {
      local_38 = heap->pages[uVar3].first;
      while (local_38 != (mi_page_t *)0x0) {
        pmVar1 = local_38->next;
        local_70.block_size = local_38->block_size;
        local_70.reserved = local_38->reserved * local_70.block_size;
        local_70.committed = local_38->capacity * local_70.block_size;
        local_70.blocks = local_38->page_start;
        local_70.used = (size_t)local_38->used;
        local_70.heap_tag = (int)local_38->heap_tag;
        local_70.full_block_size = local_70.block_size;
        _Var2 = (*visitor)(heap,&local_70,(void *)0x0,local_70.block_size,arg);
        if (_Var2 && visit_blocks) {
          _Var2 = _mi_heap_area_visit_blocks(&local_70,local_38,visitor,arg);
        }
        local_38 = pmVar1;
        if (_Var2 == false) {
          return _Var4;
        }
      }
      _Var4 = 0x49 < uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x4b);
  }
  return _Var4;
}

Assistant:

static bool mi_heap_visit_pages(mi_heap_t* heap, heap_page_visitor_fun* fn, void* arg1, void* arg2)
{
  if (heap==NULL || heap->page_count==0) return 0;

  // visit all pages
  #if MI_DEBUG>1
  size_t total = heap->page_count;
  size_t count = 0;
  #endif

  for (size_t i = 0; i <= MI_BIN_FULL; i++) {
    mi_page_queue_t* pq = &heap->pages[i];
    mi_page_t* page = pq->first;
    while(page != NULL) {
      mi_page_t* next = page->next; // save next in case the page gets removed from the queue
      mi_assert_internal(mi_page_heap(page) == heap);
      #if MI_DEBUG>1
      count++;
      #endif
      if (!fn(heap, pq, page, arg1, arg2)) return false;
      page = next; // and continue
    }
  }
  mi_assert_internal(count == total);
  return true;
}